

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

string * __thiscall
NinePatchMargin::writeXml_abi_cxx11_
          (string *__return_storage_ptr__,NinePatchMargin *this,int indent)

{
  int indent_00;
  ostream *poVar1;
  stringstream str;
  char *local_258;
  long local_250;
  char local_248 [16];
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Util::getIndent_abi_cxx11_(0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_258,local_250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<NinePatchMargin>",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Top","");
  indent_00 = indent + 1;
  Util::writeXmlElement<int>((stringstream *)local_1b8,indent_00,&local_1d8,this->top);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Left","");
  Util::writeXmlElement<int>((stringstream *)local_1b8,indent_00,&local_1f8,this->left);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Right","");
  Util::writeXmlElement<int>((stringstream *)local_1b8,indent_00,&local_218,this->right);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Bottom","");
  Util::writeXmlElement<int>((stringstream *)local_1b8,indent_00,&local_238,this->bottom);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  Util::getIndent_abi_cxx11_(0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_258,local_250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</NinePatchMargin>",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string NinePatchMargin::writeXml(int indent) const
{
	std::stringstream str;
	
	str << Util::getIndent(indent) << "<NinePatchMargin>" << std::endl;
	Util::writeXmlElement(str, indent + 1, "Top", top);
	Util::writeXmlElement(str, indent + 1, "Left", left);
	Util::writeXmlElement(str, indent + 1, "Right", right);
	Util::writeXmlElement(str, indent + 1, "Bottom", bottom);
	str << Util::getIndent(indent) << "</NinePatchMargin>" << std::endl;

	return str.str();
}